

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minheap_test.cpp
# Opt level: O0

int main(void)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  event *peVar4;
  int local_205c;
  int i_1;
  event *e;
  uint32_t index;
  int rst;
  int sum;
  int local_2034;
  undefined1 local_2030 [4];
  int i;
  MinHeap<event> MinHeap;
  event *inserted [1024];
  
  sznet::MinHeap<event>::MinHeap((MinHeap<event> *)local_2030,event_greater);
  for (local_2034 = 0; local_2034 < 0x400; local_2034 = local_2034 + 1) {
    peVar4 = (event *)malloc(0x18);
    inserted[(long)local_2034 + -1] = peVar4;
    set_random_timeout(inserted[(long)local_2034 + -1]);
    sznet::MinHeap<event>::push((MinHeap<event> *)local_2030,inserted[(long)local_2034 + -1]);
  }
  sznet::MinHeap<event>::checkHeap((MinHeap<event> *)local_2030);
  uVar1 = sznet::MinHeap<event>::size((MinHeap<event> *)local_2030);
  if (uVar1 == 0x400) {
    index = 0x200;
    while( true ) {
      do {
        if ((int)index < 1) {
          sznet::MinHeap<event>::checkHeap((MinHeap<event> *)local_2030);
          uVar1 = sznet::MinHeap<event>::size((MinHeap<event> *)local_2030);
          if (uVar1 != 0x200) {
            __assert_fail("MinHeap.size() == 512",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                          ,0x5b,"int main()");
          }
          index = 500;
          while( true ) {
            if ((int)index < 1) {
              sznet::MinHeap<event>::checkHeap((MinHeap<event> *)local_2030);
              uVar1 = sznet::MinHeap<event>::size((MinHeap<event> *)local_2030);
              if (uVar1 == 0xc) {
                sznet::MinHeap<event>::levelPrint((MinHeap<event> *)local_2030,event_getstr);
                for (local_205c = 0; local_205c < 0x400; local_205c = local_205c + 1) {
                  free(inserted[(long)local_205c + -1]);
                }
                sznet::MinHeap<event>::~MinHeap((MinHeap<event> *)local_2030);
                return 0;
              }
              __assert_fail("MinHeap.size() == 12",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                            ,0x67,"int main()");
            }
            peVar4 = sznet::MinHeap<event>::pop((MinHeap<event> *)local_2030);
            if (peVar4 == (event *)0x0) break;
            index = index - 1;
          }
          __assert_fail("e != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                        ,0x62,"int main()");
        }
        iVar2 = rand();
        uVar3 = iVar2 % 0x400;
        uVar1 = sznet::MinHeap<event>::size((MinHeap<event> *)local_2030);
      } while ((uVar1 <= uVar3) ||
              ((inserted[(ulong)uVar3 - 1]->super_MinHeaBaseElem).min_heap_idx == -1));
      iVar2 = sznet::MinHeap<event>::erase((MinHeap<event> *)local_2030,inserted[(ulong)uVar3 - 1]);
      if (iVar2 != 0) break;
      index = index - 1;
    }
    __assert_fail("rst == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                  ,0x56,"int main()");
  }
  __assert_fail("MinHeap.size() == 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                ,0x4b,"int main()");
}

Assistant:

int main()
{
	event* inserted[1024];
	MinHeap<event> MinHeap(&event_greater);

	for (int i = 0; i < 1024; ++i)
	{
		inserted[i] = (event*)malloc(sizeof(event));
		set_random_timeout(inserted[i]);
		MinHeap.push(inserted[i]);
	}

	MinHeap.checkHeap();
	assert(MinHeap.size() == 1024);
	// MinHeap.LevelPrint(event_getstr);

	int sum = 512;
	int rst = 0;
	while (sum > 0)
	{
		uint32_t index = rand() % 1024;
		if (index < MinHeap.size() && inserted[index]->min_heap_idx != -1)
		{
			rst = MinHeap.erase(inserted[index]);
			assert(rst == 0);
			--sum;
		}
	}
	MinHeap.checkHeap();
	assert(MinHeap.size() == 512);

	sum = 500;
	event* e = nullptr;
	while (sum > 0)
	{
		e = MinHeap.pop();
		assert(e != nullptr);
		--sum;
	}

	MinHeap.checkHeap();
	assert(MinHeap.size() == 12);
	MinHeap.levelPrint(event_getstr);

	for (int i = 0; i < 1024; ++i)
	{
		free(inserted[i]);
	}

	return 0;
}